

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::FlushExprTreeVector
          (WatWriter *this,
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          *expr_trees)

{
  int iVar1;
  WatWriter *base;
  BlockExprBase<(wabt::ExprType)7> *pBVar2;
  char *pcVar3;
  BlockExprBase<(wabt::ExprType)22> *pBVar4;
  IfExceptExpr *expr;
  pointer pEVar5;
  ExprVisitor local_b8;
  Delegate local_68;
  ExprVisitorDelegate delegate;
  ExprTree expr_tree;
  
  pEVar5 = (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_start;
  expr_tree.children.
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (expr_trees->
       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pEVar5 == expr_tree.children.
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      return;
    }
    ExprTree::ExprTree((ExprTree *)&delegate.writer_,pEVar5);
    base = delegate.writer_;
    iVar1 = *(int *)&((delegate.writer_)->label_stack_).
                     super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1 == 0x2e) {
      expr = (IfExceptExpr *)cast<wabt::TryExpr,wabt::Expr>((Expr *)delegate.writer_);
      WritePuts(this,"(",None);
      pcVar3 = Opcode::GetName((Opcode *)&Opcode::Try_Opcode);
      WriteBeginBlock(this,Try,&expr->true_,pcVar3);
      FlushExprTreeVector(this,(vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                *)&expr_tree);
      WriteFoldedExprList(this,&(expr->true_).exprs);
      FlushExprTreeStack(this);
      WriteOpenNewline(this,"catch");
LAB_00db35c0:
      WriteFoldedExprList(this,&expr->false_);
      FlushExprTreeStack(this);
      WriteCloseNewline(this);
    }
    else if (iVar1 == 0x13) {
      expr = (IfExceptExpr *)cast<wabt::IfExpr,wabt::Expr>((Expr *)delegate.writer_);
      WritePuts(this,"(",None);
      pcVar3 = Opcode::GetName((Opcode *)&Opcode::If_Opcode);
      WriteBeginBlock(this,If,&expr->true_,pcVar3);
      FlushExprTreeVector(this,(vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                *)&expr_tree);
      WriteOpenNewline(this,"then");
      WriteFoldedExprList(this,&(expr->true_).exprs);
      FlushExprTreeStack(this);
      WriteCloseNewline(this);
      if ((expr->false_).size_ != 0) {
        WriteOpenNewline(this,"else");
        goto LAB_00db35c0;
      }
    }
    else if (iVar1 == 0x14) {
      expr = cast<wabt::IfExceptExpr,wabt::Expr>((Expr *)delegate.writer_);
      WritePuts(this,"(",None);
      WriteBeginIfExceptBlock(this,expr);
      FlushExprTreeVector(this,(vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                *)&expr_tree);
      WriteOpenNewline(this,"then");
      WriteFoldedExprList(this,&(expr->true_).exprs);
      FlushExprTreeStack(this);
      WriteCloseNewline(this);
      if ((expr->false_).size_ != 0) {
        WriteOpenNewline(this,"else");
        goto LAB_00db35c0;
      }
    }
    else {
      if (iVar1 == 0x16) {
        WritePuts(this,"(",None);
        pBVar4 = cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>((Expr *)base);
        pcVar3 = Opcode::GetName((Opcode *)&Opcode::Loop_Opcode);
        WriteBeginBlock(this,Loop,&pBVar4->block,pcVar3);
        pBVar4 = cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>((Expr *)base);
      }
      else {
        if (iVar1 != 7) {
          WritePuts(this,"(",None);
          local_68._vptr_Delegate = (_func_int **)&PTR__Delegate_013e4620;
          delegate.super_Delegate._vptr_Delegate = (_func_int **)this;
          ExprVisitor::ExprVisitor(&local_b8,&local_68);
          ExprVisitor::VisitExpr(&local_b8,(Expr *)base);
          ExprVisitor::~ExprVisitor(&local_b8);
          this->indent_ = this->indent_ + 2;
          FlushExprTreeVector(this,(vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                    *)&expr_tree);
          goto LAB_00db35e2;
        }
        WritePuts(this,"(",None);
        pBVar2 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>((Expr *)base);
        pcVar3 = Opcode::GetName((Opcode *)&Opcode::Block_Opcode);
        WriteBeginBlock(this,Block,&pBVar2->block,pcVar3);
        pBVar4 = (BlockExprBase<(wabt::ExprType)22> *)
                 cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>((Expr *)base);
      }
      WriteFoldedExprList(this,&(pBVar4->block).exprs);
      FlushExprTreeStack(this);
    }
LAB_00db35e2:
    WriteCloseNewline(this);
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::~vector((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               *)&expr_tree);
    pEVar5 = pEVar5 + 1;
  } while( true );
}

Assistant:

void WatWriter::FlushExprTreeVector(const std::vector<ExprTree>& expr_trees) {
  WABT_TRACE_ARGS(FlushExprTreeVector, "%zu", expr_trees.size());
  for (auto expr_tree : expr_trees) {
    FlushExprTree(expr_tree);
  }
}